

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O2

rfc5444_result cb_blocktlv_address(rfc5444_reader_tlvblock_context *ctx)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar4 = (ctx->addr)._addr[3] - 1;
  uVar2 = ctx->consumer->order;
  lVar5 = (long)(int)uVar2;
  lVar1 = lVar5 + -1;
  uVar6 = (ulong)bVar4;
  printf("%s: address %d blocktlv (order %d): %d\n","cb_blocktlv_address",(ulong)(bVar4 + 1),
         (ulong)uVar2,(ulong)(uint)callback_index);
  bVar7 = consumer_entries[0].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  iVar3 = callback_index + 1;
  *(int *)(lVar5 * 8 + 0x115628 + uVar6 * 4) = callback_index;
  callback_index = iVar3;
  lVar5 = lVar5 * 4 + 0x11563c + uVar6 * 2;
  *(bool *)lVar5 = bVar7;
  if (bVar7) {
    consumer_entries[0].drop = droptlv_blocktlv_address[lVar1][uVar6][0];
  }
  bVar7 = consumer_entries[1].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  *(bool *)(lVar5 + 1) = bVar7;
  if (bVar7) {
    consumer_entries[1].drop = *(_Bool *)(lVar1 * 4 + 0x115649 + uVar6 * 2);
  }
  return result_blockcb_address[lVar1][uVar6];
}

Assistant:

static enum rfc5444_result
cb_blocktlv_address(struct rfc5444_reader_tlvblock_context *ctx) {
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;
  int oi = ctx->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: address %d blocktlv (order %d): %d\n",
      __func__, ai+1, ctx->consumer->order, callback_index);
#endif
  idxcb_blocktlv_address[oi][ai] = callback_index++;

  if ((gottlv_blocktlv_address[oi][ai][0] = consumer_entries[0].tlv != NULL)) {
    consumer_entries[0].drop = droptlv_blocktlv_address[oi][ai][0];
  }
  if ((gottlv_blocktlv_address[oi][ai][1] = consumer_entries[1].tlv != NULL)) {
    consumer_entries[1].drop = droptlv_blocktlv_address[oi][ai][1];
  }

  return result_blockcb_address[oi][ai];
}